

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_test.cpp
# Opt level: O0

void model_test::comparisonTest(void)

{
  ModelImpl *this;
  SystemImpl *this_00;
  SystemImpl *this_01;
  FlowExp *this_02;
  ModelImpl *this_03;
  ModelImpl *m1;
  FlowExp *f;
  SystemImpl *s2;
  SystemImpl *s1;
  ModelImpl *m;
  
  this = (ModelImpl *)operator_new(0x60);
  ModelImpl::ModelImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  this_01 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_01);
  this_02 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(this_02,(System *)this_00,(System *)this_01);
  this_03 = (ModelImpl *)operator_new(0x60);
  ModelImpl::ModelImpl(this_03);
  (**(code **)(*(long *)this + 8))(this,this_02);
  (**(code **)(*(long *)this_03 + 8))(this_03,this_02);
  if (this != this_03) {
    return;
  }
  __assert_fail("m != m1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/model_test.cpp"
                ,0x27,"static void model_test::comparisonTest()");
}

Assistant:

void model_test::comparisonTest() {
    auto *m = new ModelImpl();
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *f = new FlowExp(s1, s2);

    auto *m1 = new ModelImpl();
    m->add(f);
    m1->add(f);
    assert(m != m1);
}